

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void solver_started_cb(solver_parameters *params)

{
  char (*in_RSI) [15];
  long *format_str;
  solver_parameters *params_local;
  
  fmt::v7::print<char[15],,char>((v7 *)"Solver starts\n",in_RSI);
  format_str = &params->limit;
  fmt::v7::
  print<char[148],long_const&,double_const&,baryonyx::solver_parameters::floating_point_type_const&,int_const&,baryonyx::solver_parameters::mode_type_const&,baryonyx::solver_parameters::observer_type_const&,char>
            ((char (*) [148])
             " * Global parameters:\n  - limit: {}\n  - time-limit: {:.10g}s\n  - floating-point-type: {}\n  - print-level: {}\n  - auto-tune: {}\n  - observation: {}\n"
             ,format_str,&params->time_limit,&params->float_type,&params->print_level,&params->mode,
             &params->observer);
  if (params->solver == bastert) {
    fmt::v7::
    print<char[197],baryonyx::solver_parameters::pre_constraint_order_const&,baryonyx::solver_parameters::constraint_order_const&,double_const&,double_const&,double_const&,double_const&,double_const&,double_const&,double_const&,baryonyx::solver_parameters::cost_norm_type_const&,char>
              ((char (*) [197])
               " * In The Middle parameters:\n  - preprocessing: {}\n  - constraint-order: {}\n  - theta: {:.10g}\n  - delta: {:.10g}\n  - kappa: {:.10g} {:.10g} {:.10g}\n  - alpha: {:.10g}\n  - w: {:.10g}\n  - norm: {}\n"
               ,&params->pre_order,&params->order,&params->theta,&params->delta,&params->kappa_min,
               &params->kappa_step,&params->kappa_max,&params->alpha,&params->w,&params->cost_norm);
    fmt::v7::print<char[154],int_const&,double_const&,int_const&,double_const&,char>
              ((char (*) [154])
               " * Pushes system parameters:\n  - pushes-limit: {}\n  - pushing-objective-amplifier: {:.10g}\n  - pushing-iteration-limit: {}\n  - pushing-k-factor: {:.10g}\n"
               ,&params->pushes_limit,&params->pushing_objective_amplifier,
               &params->pushing_iteration_limit,&params->pushing_k_factor);
    fmt::v7::print<char[85],baryonyx::solver_parameters::init_policy_type_const&,double_const&,char>
              ((char (*) [85])
               " * Solver initialization parameters:\n  - init-policy: {}\n  - init-policy-random: {}\n"
               ,&params->init_policy,&params->init_policy_random);
    fmt::v7::
    print<char[450],int_const&,double_const&,double_const&,double_const&,double_const&,double_const&,double_const&,double_const&,double_const&,double_const&,double_const&,char>
              ((char (*) [450])
               " * Optimizer initialization parameters:\n  - init-population-size: {}\n  - init-crossover-bastert-insertion: {}\n  - init-crossover-solution-selection-mean: {}\n  - init-crossover-solution-selection-stddev: {}\n  - init-mutation-variable-mean: {}\n  - init-mutation-variable-stddev: {}\n  - init-mutation-value-mean: {}\n  - init-mutation-value-stddev: {}\n  - init-kappa-improve-start: {}\n  - init-kappa-improve-increase: {}\n  - init-kappa-improve-stop: {}\n"
               ,&params->init_population_size,&params->init_crossover_bastert_insertion,
               &params->init_crossover_solution_selection_mean,
               &params->init_crossover_solution_selection_stddev,
               &params->init_mutation_variable_mean,&params->init_mutation_variable_stddev,
               &params->init_mutation_value_mean,&params->init_mutation_value_stddev,
               &params->init_kappa_improve_start,&params->init_kappa_improve_increase,
               &params->init_kappa_improve_stop);
  }
  else {
    fmt::v7::print<char[54],,char>
              ((v7 *)" * Random solvers:\n  - random: bernouilli with p=0.5\n",
               (char (*) [54])format_str);
  }
  return;
}

Assistant:

static void
solver_started_cb(const baryonyx::solver_parameters& params)
{
    fmt::print("Solver starts\n");

    fmt::print(" * Global parameters:\n"
               "  - limit: {}\n"
               "  - time-limit: {:.10g}s\n"
               "  - floating-point-type: {}\n"
               "  - print-level: {}\n"
               "  - auto-tune: {}\n"
               "  - observation: {}\n",
               params.limit,
               params.time_limit,
               params.float_type,
               params.print_level,
               params.mode,
               params.observer);

    if (params.solver == baryonyx::solver_parameters::solver_type::bastert) {
        fmt::print(" * In The Middle parameters:\n"
                   "  - preprocessing: {}\n"
                   "  - constraint-order: {}\n"
                   "  - theta: {:.10g}\n"
                   "  - delta: {:.10g}\n"
                   "  - kappa: {:.10g} {:.10g} {:.10g}\n"
                   "  - alpha: {:.10g}\n"
                   "  - w: {:.10g}\n"
                   "  - norm: {}\n",
                   params.pre_order,
                   params.order,
                   params.theta,
                   params.delta,
                   params.kappa_min,
                   params.kappa_step,
                   params.kappa_max,
                   params.alpha,
                   params.w,
                   params.cost_norm);

        fmt::print(" * Pushes system parameters:\n"
                   "  - pushes-limit: {}\n"
                   "  - pushing-objective-amplifier: {:.10g}\n"
                   "  - pushing-iteration-limit: {}\n"
                   "  - pushing-k-factor: {:.10g}\n",
                   params.pushes_limit,
                   params.pushing_objective_amplifier,
                   params.pushing_iteration_limit,
                   params.pushing_k_factor);

        fmt::print(" * Solver initialization parameters:\n"
                   "  - init-policy: {}\n"
                   "  - init-policy-random: {}\n",
                   params.init_policy,
                   params.init_policy_random);

        fmt::print(" * Optimizer initialization parameters:\n"
                   "  - init-population-size: {}\n"
                   "  - init-crossover-bastert-insertion: {}\n"
                   "  - init-crossover-solution-selection-mean: {}\n"
                   "  - init-crossover-solution-selection-stddev: {}\n"
                   "  - init-mutation-variable-mean: {}\n"
                   "  - init-mutation-variable-stddev: {}\n"
                   "  - init-mutation-value-mean: {}\n"
                   "  - init-mutation-value-stddev: {}\n"
                   "  - init-kappa-improve-start: {}\n"
                   "  - init-kappa-improve-increase: {}\n"
                   "  - init-kappa-improve-stop: {}\n",
                   params.init_population_size,
                   params.init_crossover_bastert_insertion,
                   params.init_crossover_solution_selection_mean,
                   params.init_crossover_solution_selection_stddev,
                   params.init_mutation_variable_mean,
                   params.init_mutation_variable_stddev,
                   params.init_mutation_value_mean,
                   params.init_mutation_value_stddev,
                   params.init_kappa_improve_start,
                   params.init_kappa_improve_increase,
                   params.init_kappa_improve_stop);
    } else {
        fmt::print(" * Random solvers:\n"
                   "  - random: bernouilli with p=0.5\n");
    }
}